

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btUnionFind.cpp
# Opt level: O0

void __thiscall btUnionFind::~btUnionFind(btUnionFind *this)

{
  Free((btUnionFind *)0x1a48c8);
  btAlignedObjectArray<btElement>::~btAlignedObjectArray
            ((btAlignedObjectArray<btElement> *)0x1a48d4);
  return;
}

Assistant:

btUnionFind::~btUnionFind()
{
	Free();

}